

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

uint32_t rgbcx::bc1_find_sels3_fullerr
                   (bool use_black,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  uint a;
  uint a_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_RSI;
  byte in_DIL;
  uint32_t in_R9D;
  undefined1 uVar6;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  long in_stack_00000018;
  uint in_stack_00000020;
  uint32_t err3;
  uint32_t err2;
  uint32_t err1;
  uint32_t best_sel;
  uint32_t best_err;
  int b;
  int g;
  int r;
  uint32_t i;
  uint32_t total_err;
  uint32_t block_b [3];
  uint32_t block_g [3];
  uint32_t block_r [3];
  uint32_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff90;
  uint local_5c;
  uint local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  bc1_get_block_colors3
            ((uint32_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_00000010),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000008),
             in_stack_ffffffffffffff5c,in_R9D,0,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff90);
  local_48 = 0;
  local_4c = 0;
  while( true ) {
    if (0xf < local_4c) {
      return local_48;
    }
    uVar5 = (uint)*(byte *)(in_RSI + (ulong)local_4c * 4);
    a = (uint)*(byte *)(in_RSI + 1 + (ulong)local_4c * 4);
    a_00 = (uint)*(byte *)(in_RSI + 2 + (ulong)local_4c * 4);
    iVar1 = squarei(local_2c - uVar5);
    iVar2 = squarei(local_38 - a);
    iVar1 = iVar1 + iVar2;
    iVar2 = squarei(local_44 - a_00);
    iVar3 = squarei(local_28 - uVar5);
    iVar4 = squarei(local_34 - a);
    iVar3 = iVar3 + iVar4;
    iVar4 = squarei(local_40 - a_00);
    uVar6 = (uint)(iVar3 + iVar4) < (uint)(iVar1 + iVar2);
    local_5c = iVar1 + iVar2;
    if ((bool)uVar6) {
      local_5c = iVar3 + iVar4;
    }
    iVar1 = squarei(local_24 - uVar5);
    iVar2 = squarei(local_30 - a);
    iVar1 = iVar1 + iVar2;
    iVar2 = squarei(local_3c - a_00);
    if ((uint)(iVar1 + iVar2) < local_5c) {
      uVar6 = 2;
      local_5c = iVar1 + iVar2;
    }
    if ((in_DIL & 1) != 0) {
      iVar2 = squarei(uVar5);
      iVar1 = squarei(a);
      iVar4 = squarei(a_00);
      uVar5 = iVar2 + iVar1 + iVar4;
      if (uVar5 < local_5c) {
        uVar6 = 3;
        local_5c = uVar5;
      }
    }
    local_48 = local_5c + local_48;
    if (in_stack_00000020 <= local_48) break;
    *(undefined1 *)(in_stack_00000018 + (ulong)local_4c) = uVar6;
    local_4c = local_4c + 1;
  }
  return local_48;
}

Assistant:

static inline uint32_t bc1_find_sels3_fullerr(bool use_black, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t block_r[3], block_g[3], block_b[3];
		bc1_get_block_colors3(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);
								
		uint32_t total_err = 0;

		for (uint32_t i = 0; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r;
			const int g = pSrc_pixels[i].g;
			const int b = pSrc_pixels[i].b;

			uint32_t best_err = squarei((int)block_r[0] - (int)r) + squarei((int)block_g[0] - (int)g) + squarei((int)block_b[0] - (int)b);
			uint32_t best_sel = 0;

			uint32_t err1 = squarei((int)block_r[1] - (int)r) + squarei((int)block_g[1] - (int)g) + squarei((int)block_b[1] - (int)b);
			if (err1 < best_err)
			{
				best_err = err1;
				best_sel = 1;
			}

			uint32_t err2 = squarei((int)block_r[2] - (int)r) + squarei((int)block_g[2] - (int)g) + squarei((int)block_b[2] - (int)b);
			if (err2 < best_err)
			{
				best_err = err2;
				best_sel = 2;
			}

			if (use_black)
			{
				uint32_t err3 = squarei(r) + squarei(g) + squarei(b);
				if (err3 < best_err)
				{
					best_err = err3;
					best_sel = 3;
				}
			}
			
			total_err += best_err;
			if (total_err >= cur_err)
				return total_err;
			
			sels[i] = (uint8_t)best_sel;
		}

		return total_err;
	}